

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02a.cpp
# Opt level: O3

int day2a::get_bathroom_code(string *input)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  string line;
  istringstream stream;
  byte *local_1d0;
  undefined8 local_1c8;
  byte local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  iVar6 = 1;
  uVar5 = 0;
  uVar8 = 1;
  uVar7 = 1;
  while (piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_1d0),
        ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
    bVar1 = *local_1d0;
    pbVar4 = local_1d0;
    while (bVar1 != 0) {
      pbVar4 = pbVar4 + 1;
      if (bVar1 < 0x52) {
        if (bVar1 == 0x44) {
          bVar2 = 1 < (int)uVar7;
          uVar7 = uVar7 + 1;
          if (bVar2) {
            uVar7 = 2;
          }
        }
        else if ((bVar1 == 0x4c) && (bVar2 = (int)uVar8 < 1, uVar8 = uVar8 - 1, bVar2)) {
          uVar8 = 0;
        }
      }
      else if (bVar1 == 0x52) {
        bVar2 = 1 < (int)uVar8;
        uVar8 = uVar8 + 1;
        if (bVar2) {
          uVar8 = 2;
        }
      }
      else if ((bVar1 == 0x55) && (bVar2 = (int)uVar7 < 1, uVar7 = uVar7 - 1, bVar2)) {
        uVar7 = 0;
      }
      bVar1 = *pbVar4;
    }
    uVar5 = uVar5 + (char)keypad[(ulong)uVar8 + (ulong)uVar7 * 3] * iVar6;
    iVar6 = iVar6 * 10;
  }
  iVar6 = 0;
  if (0 < (int)uVar5) {
    do {
      iVar6 = uVar5 % 10 + iVar6 * 10;
      bVar2 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar2);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return iVar6;
}

Assistant:

int get_bathroom_code(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		Position position{1,1};
		int code = 0;
		int i = 1;
		while(stream >> line) {
			const char* p = line.c_str();
			while(*p) {
				switch(*p++) {
				case 'U': if(position.y > 0) --position.y; break;
				case 'R': if(position.x < 2) ++position.x; break;
				case 'D': if(position.y < 2) ++position.y; break;
				case 'L': if(position.x > 0) --position.x; break;
				}
			}
			code += keypad[position.x + position.y * width] * i;
			i *= 10;
		}
		return reverse(code, 10);
	}